

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v7::detail::fallback_format<double>
               (double d,int num_digits,bool binary32,buffer<char> *buf,int *exp10)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  type tVar5;
  uint uVar6;
  bigint *lhs2;
  uint64_t value_00;
  int iVar7;
  undefined7 in_register_00000031;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  bigint *local_328;
  fp value;
  bigint denominator;
  bigint numerator;
  bigint lower;
  bigint upper_store;
  ulong uVar11;
  
  numerator.bigits_.super_buffer<unsigned_int>.size_ = 0;
  numerator.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0078f6e0;
  numerator.bigits_.super_buffer<unsigned_int>.ptr_ = numerator.bigits_.store_;
  numerator.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  numerator.exp_ = 0;
  denominator.bigits_.super_buffer<unsigned_int>.size_ = 0;
  denominator.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0078f6e0;
  denominator.bigits_.super_buffer<unsigned_int>.ptr_ = denominator.bigits_.store_;
  denominator.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  denominator.exp_ = 0;
  lower.bigits_.super_buffer<unsigned_int>.size_ = 0;
  lower.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0078f6e0;
  lower.bigits_.super_buffer<unsigned_int>.ptr_ = lower.bigits_.store_;
  lower.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  lower.exp_ = 0;
  local_328 = &upper_store;
  upper_store.bigits_.super_buffer<unsigned_int>.size_ = 0;
  upper_store.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0078f6e0;
  upper_store.bigits_.super_buffer<unsigned_int>.ptr_ = upper_store.bigits_.store_;
  upper_store.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  upper_store.exp_ = 0;
  value.f = 0;
  value.e = 0;
  if ((int)CONCAT71(in_register_00000031,binary32) == 0) {
    bVar2 = fp::assign<double,_0>(&value,d);
  }
  else {
    bVar2 = fp::assign<float,_0>(&value,(float)d);
  }
  iVar7 = bVar2 + 1;
  value_00 = value.f << (sbyte)iVar7;
  if (value.e < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10(&numerator,-*exp10);
      bigint::assign(&lower,&numerator);
      if (bVar2 == false) {
        local_328 = (bigint *)0x0;
      }
      else {
        local_328 = &upper_store;
        bigint::assign(local_328,&numerator);
        bigint::operator<<=(&upper_store,1);
      }
      bigint::operator*=(&numerator,value_00);
      bigint::assign(&denominator,1);
      bigint::operator<<=(&denominator,iVar7 - value.e);
    }
    else {
      bigint::assign(&numerator,value_00);
      bigint::assign_pow10(&denominator,*exp10);
      bigint::operator<<=(&denominator,iVar7 - value.e);
      bigint::assign(&lower,1);
      if (bVar2 == false) {
        local_328 = (bigint *)0x0;
      }
      else {
        bigint::assign(&upper_store,2);
      }
    }
  }
  else {
    bigint::assign(&numerator,value_00);
    bigint::operator<<=(&numerator,value.e);
    bigint::assign(&lower,1);
    bigint::operator<<=(&lower,value.e);
    if (bVar2 == false) {
      local_328 = (bigint *)0x0;
    }
    else {
      local_328 = &upper_store;
      bigint::assign(local_328,1);
      bigint::operator<<=(&upper_store,value.e + 1);
    }
    bigint::assign_pow10(&denominator,*exp10);
    bigint::operator<<=(&denominator,iVar7);
  }
  if (-1 < num_digits) {
    *exp10 = *exp10 - (num_digits + -1);
    uVar10 = num_digits - 1;
    uVar11 = (ulong)uVar10;
    if (num_digits == 0) {
      buffer<char>::try_resize(buf,1);
      bigint::multiply(&denominator,10);
      iVar7 = add_compare(&numerator,&numerator,&denominator);
      *buf->ptr_ = 0 < iVar7 | 0x30;
    }
    else {
      tVar5 = to_unsigned<int>(num_digits);
      buffer<char>::try_resize(buf,(ulong)tVar5);
      for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
        iVar7 = bigint::divmod_assign(&numerator,&denominator);
        buf->ptr_[uVar8] = (char)iVar7 + '0';
        bigint::multiply(&numerator,10);
      }
      uVar6 = bigint::divmod_assign(&numerator,&denominator);
      iVar7 = add_compare(&numerator,&numerator,&denominator);
      if ((0 < iVar7) || ((uVar6 & 1) != 0 && iVar7 == 0)) {
        if (uVar6 == 9) {
          buf->ptr_[(int)uVar10] = ':';
          while( true ) {
            pcVar1 = buf->ptr_;
            if (((int)uVar11 < 1) || (pcVar1[uVar11] != ':')) break;
            pcVar1[uVar11] = '0';
            uVar11 = (ulong)((int)uVar11 - 1);
            buf->ptr_[uVar11] = buf->ptr_[uVar11] + '\x01';
          }
          if (*pcVar1 == ':') {
            *pcVar1 = '1';
            *exp10 = *exp10 + 1;
          }
          goto LAB_0032582e;
        }
        uVar6 = uVar6 + 1;
      }
      buf->ptr_[(int)uVar10] = (char)uVar6 + '0';
    }
    goto LAB_0032582e;
  }
  lhs2 = local_328;
  if (local_328 == (bigint *)0x0) {
    lhs2 = &lower;
  }
  pcVar1 = buf->ptr_;
  uVar10 = ~(uint)value.f & 1;
  lVar9 = 0;
  while( true ) {
    uVar6 = bigint::divmod_assign(&numerator,&denominator);
    iVar7 = compare(&numerator,&lower);
    iVar4 = add_compare(&numerator,lhs2,&denominator);
    pcVar1[lVar9] = (char)uVar6 + '0';
    if ((iVar7 < (int)uVar10) || ((int)-uVar10 < iVar4)) break;
    bigint::multiply(&numerator,10);
    bigint::multiply(&lower,10);
    if (local_328 != (bigint *)0x0) {
      bigint::multiply(local_328,10);
    }
    lVar9 = lVar9 + 1;
  }
  if (iVar7 < (int)uVar10) {
    if ((int)-uVar10 < iVar4) {
      iVar7 = add_compare(&numerator,&numerator,&denominator);
      if ((0 < iVar7) || ((uVar6 & 1) != 0 && iVar7 == 0)) {
        cVar3 = pcVar1[lVar9] + '\x01';
        goto LAB_00325788;
      }
    }
  }
  else {
    cVar3 = (char)uVar6 + '1';
LAB_00325788:
    pcVar1[lVar9] = cVar3;
  }
  tVar5 = to_unsigned<int>((int)lVar9 + 1);
  buffer<char>::try_resize(buf,(ulong)tVar5);
  *exp10 = *exp10 - (int)lVar9;
LAB_0032582e:
  bigint::~bigint(&upper_store);
  bigint::~bigint(&lower);
  bigint::~bigint(&denominator);
  bigint::~bigint(&numerator);
  return;
}

Assistant:

void fallback_format(Double d, int num_digits, bool binary32, buffer<char>& buf,
                     int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  const bool is_predecessor_closer =
      binary32 ? value.assign(static_cast<float>(d)) : value.assign(d);
  int shift = is_predecessor_closer ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    if (!upper) upper = &lower;
    bool even = (value.f & 1) == 0;
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    buf.try_resize(1);
    denominator *= 10;
    buf[0] = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}